

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-queue.c
# Opt level: O2

_Bool qp_isinvalid(priority_queue *qp)

{
  int *piVar1;
  int iVar2;
  priority_queue_element *ppVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  
  bVar4 = true;
  if ((qp != (priority_queue *)0x0) && (uVar5 = qp->count, uVar5 <= qp->size)) {
    if (uVar5 < 2) {
      bVar4 = false;
    }
    else {
      if ((uVar5 & 1) == 0) {
        if (qp->data[uVar5 - 1].priority < *(wchar_t *)((long)qp->data + uVar5 * 8 + -8)) {
          return true;
        }
        uVar5 = uVar5 - 2;
      }
      else {
        uVar5 = uVar5 - 1;
      }
      uVar6 = uVar5 << 4 | 8;
      do {
        bVar4 = uVar5 >= 2;
        if (uVar5 < 2) {
          return bVar4;
        }
        ppVar3 = qp->data;
        iVar2 = *(int *)((long)&ppVar3->priority + (uVar5 * 8 - 8 & 0xfffffffffffffff0));
        if (*(int *)((long)&ppVar3->payload + uVar6) < iVar2) {
          return bVar4;
        }
        uVar5 = uVar5 - 2;
        piVar1 = (int *)((long)&ppVar3[-1].payload + uVar6);
        uVar6 = uVar6 - 0x20;
      } while (iVar2 <= *piVar1);
    }
  }
  return bVar4;
}

Assistant:

bool qp_isinvalid(const struct priority_queue *qp)
{
	size_t start, parent;

	if (!qp || qp->count > qp->size) {
		return true;
	}

	/* Queues with less than two elements have nothing to check. */
	if (qp->count < 2) {
		return false;
	}

	if ((qp->count & 1) == 0) {
		/*
		 * On the deepest layer, there is a node that does not have
		 * a sibling with the same parent.
		 */
		parent = (qp->count - 2) >> 1;
		if (qp->data[qp->count - 1].priority
				< qp->data[parent].priority) {
			return true;
		}
		start = qp->count - 2;
	} else {
		/* All nodes on the deepest layer have a sibling. */
		start = qp->count - 1;
	}

	while (start > 1) {
		parent = (start - 1) >> 1;
		if (qp->data[start].priority < qp->data[parent].priority
				|| qp->data[start - 1].priority
				< qp->data[parent].priority) {
			return true;
		}
		start -= 2;
	}
	return false;
}